

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::~CodeGeneratorResponse
          (CodeGeneratorResponse *this)

{
  Arena *pAVar1;
  CodeGeneratorResponse *this_local;
  
  pAVar1 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::~RepeatedPtrField
            (&this->file_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

CodeGeneratorResponse::~CodeGeneratorResponse() {
  // @@protoc_insertion_point(destructor:google.protobuf.compiler.CodeGeneratorResponse)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}